

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O1

int FileReadCol(char *filename)

{
  FILE *__stream;
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  char str [4096];
  char local_1008 [4096];
  
  __stream = fopen(filename,"r");
  fgets(local_1008,0x1000,__stream);
  sVar1 = strlen(local_1008);
  if (sVar1 == 0) {
    uVar4 = 1;
  }
  else {
    sVar2 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (uint)(local_1008[sVar2] == ',');
      sVar2 = sVar2 + 1;
    } while (sVar1 != sVar2);
    uVar4 = iVar3 + 1;
  }
  printf(anon_var_dwarf_21fd,(ulong)uVar4);
  return uVar4;
}

Assistant:

int FileReadCol(const char *filename) {
    FILE *f = fopen(filename, "r");
    int i = 0;
    char str[4096];
    fgets(str, 4096, f);
    for (int j = 0; j < strlen(str); j++) {
        if (',' == str[j]) i++;
    }
    i++;// 数据数=逗号数+1
    printf("数组列数：%d\n", i);
    return i;
}